

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

bool __thiscall
EthBasePort::WriteQuadletNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t data,uchar flags)

{
  int iVar1;
  uint uVar2;
  uint extraout_EDX;
  undefined6 in_register_00000032;
  uchar *puVar3;
  allocator<char> local_5d;
  quadlet_t local_5c;
  nodeaddr_t local_58;
  string local_50 [32];
  
  local_58 = addr;
  if ((int)CONCAT62(in_register_00000032,node) != 0x3f) {
    std::__cxx11::string::string<std::allocator<char>>(local_50,"WriteQuadlet",&local_5d);
    iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_50,0);
    std::__cxx11::string::~string(local_50);
    if ((char)iVar1 == '\0') {
      return false;
    }
  }
  BasePort::SetGenericBuffer(&this->super_BasePort);
  puVar3 = (this->super_BasePort).GenericBuffer;
  uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
  puVar3 = puVar3 + uVar2;
  local_5c = data;
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
  this->fw_tl = this->fw_tl + 1 & 0x3f;
  (*(this->super_BasePort)._vptr_BasePort[0x31])
            (this,puVar3,(ulong)(iVar1 + 0x14),node,(ulong)flags);
  make_write_header(this,puVar3,extraout_EDX,flags);
  uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
  make_qwrite_packet(this,(quadlet_t *)(puVar3 + uVar2),node,local_58,local_5c,(uint)this->fw_tl);
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                    (this,node,puVar3,(ulong)(iVar1 + 0x14),(ulong)(flags >> 7));
  return (bool)(char)iVar1;
}

Assistant:

bool EthBasePort::WriteQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t data, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("WriteQuadlet"))
        return false;

    // Use GenericBuffer, which is much larger than needed
    SetGenericBuffer();   // Make sure buffer is allocated
    unsigned char *packet = GenericBuffer+GetWriteQuadAlign();
    unsigned int packetSize = GetPrefixOffset(WR_FW_HEADER)+FW_QWRITE_SIZE;

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(packet, packetSize, node, flags);

    // Make control word
    make_write_header(packet, packetSize, flags);

    // Build FireWire packet (also byteswaps data)
    make_qwrite_packet(reinterpret_cast<quadlet_t *>(packet+GetPrefixOffset(WR_FW_HEADER)), node, addr, data, fw_tl);

    return PacketSend(node, packet, packetSize, flags&FW_NODE_ETH_BROADCAST_MASK);
}